

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2.cpp
# Opt level: O1

void * rw::ps2::driverOpen(void *o,int32 param_2,int32 param_3)

{
  long lVar1;
  long lVar2;
  ObjPipeline *pOVar3;
  
  pOVar3 = makeDefaultPipeline();
  **(undefined8 **)(engine + 0x78) = pOVar3;
  lVar2 = engine;
  lVar1 = *(long *)(engine + 0x78);
  *(undefined4 *)(lVar1 + 8) = nativeRasterOffset;
  *(code **)(lVar1 + 0x10) = rasterCreate;
  *(code **)(*(long *)(lVar2 + 0x78) + 0x18) = rasterLock;
  *(code **)(*(long *)(lVar2 + 0x78) + 0x20) = rasterUnlock;
  *(code **)(*(long *)(lVar2 + 0x78) + 0x28) = rasterLockPalette;
  *(code **)(*(long *)(lVar2 + 0x78) + 0x30) = rasterUnlockPalette;
  *(code **)(*(long *)(lVar2 + 0x78) + 0x38) = rasterNumLevels;
  *(code **)(*(long *)(lVar2 + 0x78) + 0x40) = imageFindRasterFormat;
  *(code **)(*(long *)(lVar2 + 0x78) + 0x48) = rasterFromImage;
  *(code **)(*(long *)(lVar2 + 0x78) + 0x50) = rasterToImage;
  return o;
}

Assistant:

static void*
driverOpen(void *o, int32, int32)
{
	engine->driver[PLATFORM_PS2]->defaultPipeline = makeDefaultPipeline();

	engine->driver[PLATFORM_PS2]->rasterNativeOffset = nativeRasterOffset;
	engine->driver[PLATFORM_PS2]->rasterCreate = rasterCreate;
	engine->driver[PLATFORM_PS2]->rasterLock = rasterLock;
	engine->driver[PLATFORM_PS2]->rasterUnlock = rasterUnlock;
	engine->driver[PLATFORM_PS2]->rasterLockPalette = rasterLockPalette;
	engine->driver[PLATFORM_PS2]->rasterUnlockPalette = rasterUnlockPalette;
	engine->driver[PLATFORM_PS2]->rasterNumLevels = rasterNumLevels;
	engine->driver[PLATFORM_PS2]->imageFindRasterFormat = imageFindRasterFormat;
	engine->driver[PLATFORM_PS2]->rasterFromImage = rasterFromImage;
	engine->driver[PLATFORM_PS2]->rasterToImage = rasterToImage;

	return o;
}